

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

string * __thiscall
Database::getLatestEntry_abi_cxx11_(string *__return_storage_ptr__,Database *this)

{
  bool bVar1;
  string *psVar2;
  iterator __begin1;
  iterator __end1;
  iterator local_60;
  iterator local_40;
  
  begin(&local_60,this);
  end(&local_40,this);
  while( true ) {
    bVar1 = iterator::operator!=(&local_60,&local_40);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_60);
      return __return_storage_ptr__;
    }
    psVar2 = iterator::operator*[abi_cxx11_(&local_60);
    if (psVar2->_M_string_length != 0) break;
    iterator::operator++(&local_60);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Database::getLatestEntry ()
{
  for (auto& line : *this)
  {
    if (! line.empty ())
    {
      return line;
    }
  }

  return "";
}